

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

Aig_Man_t * Saig_ManRetimeMinAreaBackward(Aig_Man_t *pNew,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Aig_Man_t *p_00;
  Vec_Int_t *vInit_00;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *Entry;
  int iBadReg;
  Vec_Int_t *vInit;
  Vec_Ptr_t *vCut;
  Vec_Ptr_t *vBadRegs;
  Aig_Man_t *pFinal;
  Aig_Man_t *pInit;
  int fVerbose_local;
  Aig_Man_t *pNew_local;
  
  vCut = Saig_ManGetRegistersToExclude(pNew);
  if ((fVerbose != 0) && (iVar1 = Vec_PtrSize(vCut), iVar1 != 0)) {
    uVar2 = Vec_PtrSize(vCut);
    printf("Excluding %d registers that cannot be backward retimed.\n",(ulong)uVar2);
  }
  while( true ) {
    Saig_ManHideBadRegs(pNew,vCut);
    Vec_PtrFree(vCut);
    p = Nwk_ManDeriveRetimingCut(pNew,0,fVerbose);
    iVar1 = Vec_PtrSize(p);
    iVar3 = Aig_ManRegNum(pNew);
    if (iVar3 <= iVar1) {
      Vec_PtrFree(p);
      return (Aig_Man_t *)0x0;
    }
    p_00 = Saig_ManRetimeDupInitState(pNew,p);
    vInit_00 = Saig_ManRetimeInitState(p_00);
    if (vInit_00 != (Vec_Int_t *)0x0) break;
    Vec_PtrFree(p);
    uVar2 = Saig_ManRetimeUnsatCore(p_00,fVerbose);
    Aig_ManStop(p_00);
    if (fVerbose != 0) {
      printf("Excluding register %d.\n",(ulong)uVar2);
    }
    vCut = Vec_PtrAlloc(1);
    iVar1 = Saig_ManPoNum(pNew);
    Entry = Aig_ManCo(pNew,iVar1 + uVar2);
    Vec_PtrPush(vCut,Entry);
  }
  pAVar4 = Saig_ManRetimeDupBackward(pNew,p,vInit_00);
  Vec_IntFree(vInit_00);
  Vec_PtrFree(p);
  Aig_ManStop(p_00);
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_ManRetimeMinAreaBackward( Aig_Man_t * pNew, int fVerbose )
{
    Aig_Man_t * pInit, * pFinal;
    Vec_Ptr_t * vBadRegs, * vCut;
    Vec_Int_t * vInit;
    int iBadReg;
    // transform the AIG to have no bad registers
    vBadRegs = Saig_ManGetRegistersToExclude( pNew );
    if ( fVerbose && Vec_PtrSize(vBadRegs) )
        printf( "Excluding %d registers that cannot be backward retimed.\n", Vec_PtrSize(vBadRegs) ); 
    while ( 1 )
    {
        Saig_ManHideBadRegs( pNew, vBadRegs );
        Vec_PtrFree( vBadRegs );
        // compute cut
        vCut = Nwk_ManDeriveRetimingCut( pNew, 0, fVerbose );
        if ( Vec_PtrSize(vCut) >= Aig_ManRegNum(pNew) )
        {
            Vec_PtrFree( vCut );
            return NULL;
        }
        // derive the initial state
        pInit = Saig_ManRetimeDupInitState( pNew, vCut );
        vInit = Saig_ManRetimeInitState( pInit );
        if ( vInit != NULL )
        {
            pFinal = Saig_ManRetimeDupBackward( pNew, vCut, vInit );
            Vec_IntFree( vInit );
            Vec_PtrFree( vCut );
            Aig_ManStop( pInit );
            return pFinal;
        }
        Vec_PtrFree( vCut );
        // there is no initial state - find the offending output
        iBadReg = Saig_ManRetimeUnsatCore( pInit, fVerbose );
        Aig_ManStop( pInit );
        if ( fVerbose )
            printf( "Excluding register %d.\n", iBadReg ); 
        // prepare to remove this output
        vBadRegs = Vec_PtrAlloc( 1 );
        Vec_PtrPush( vBadRegs, Aig_ManCo( pNew, Saig_ManPoNum(pNew) + iBadReg ) );
    }
    return NULL;
}